

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O3

GraphicsPipelineData * __thiscall
Diligent::FixedLinearAllocator::
Construct<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GraphicsPipelineData>
          (FixedLinearAllocator *this)

{
  GraphicsPipelineData *pGVar1;
  long lVar2;
  
  pGVar1 = (GraphicsPipelineData *)Allocate(this,0xe0,8);
  (pGVar1->Desc).BlendDesc.AlphaToCoverageEnable = false;
  (pGVar1->Desc).BlendDesc.IndependentBlendEnable = false;
  lVar2 = 0xb;
  do {
    *(undefined8 *)((long)(pGVar1->Desc).BlendDesc.RenderTargets + lVar2 + -0xb) = 0x101020101020000
    ;
    *(undefined2 *)((long)(pGVar1->Desc).BlendDesc.RenderTargets + lVar2 + -3) = 0xf04;
    lVar2 = lVar2 + 10;
  } while (lVar2 != 0x5b);
  (pGVar1->Desc).SampleMask = 0xffffffff;
  (pGVar1->Desc).RasterizerDesc.FillMode = FILL_MODE_SOLID;
  (pGVar1->Desc).RasterizerDesc.CullMode = CULL_MODE_BACK;
  (pGVar1->Desc).RasterizerDesc.FrontCounterClockwise = false;
  (pGVar1->Desc).RasterizerDesc.DepthClipEnable = true;
  (pGVar1->Desc).RasterizerDesc.ScissorEnable = false;
  (pGVar1->Desc).RasterizerDesc.AntialiasedLineEnable = false;
  (pGVar1->Desc).RasterizerDesc.DepthBias = 0;
  (pGVar1->Desc).RasterizerDesc.DepthBiasClamp = 0.0;
  (pGVar1->Desc).RasterizerDesc.SlopeScaledDepthBias = 0.0;
  (pGVar1->Desc).DepthStencilDesc.DepthEnable = true;
  (pGVar1->Desc).DepthStencilDesc.DepthWriteEnable = true;
  (pGVar1->Desc).DepthStencilDesc.DepthFunc = COMPARISON_FUNC_LESS;
  (pGVar1->Desc).DepthStencilDesc.StencilEnable = false;
  (pGVar1->Desc).DepthStencilDesc.StencilReadMask = 0xff;
  (pGVar1->Desc).DepthStencilDesc.StencilWriteMask = 0xff;
  (pGVar1->Desc).DepthStencilDesc.FrontFace.StencilFailOp = STENCIL_OP_KEEP;
  (pGVar1->Desc).DepthStencilDesc.FrontFace.StencilDepthFailOp = STENCIL_OP_KEEP;
  *(undefined4 *)&(pGVar1->Desc).DepthStencilDesc.FrontFace.StencilPassOp = 0x1010801;
  (pGVar1->Desc).DepthStencilDesc.BackFace.StencilPassOp = STENCIL_OP_KEEP;
  (pGVar1->Desc).DepthStencilDesc.BackFace.StencilFunc = COMPARISON_FUNC_ALWAYS;
  (pGVar1->Desc).InputLayout.LayoutElements = (LayoutElement *)0x0;
  (pGVar1->Desc).InputLayout.NumElements = 0;
  (pGVar1->Desc).PrimitiveTopology = PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  (pGVar1->Desc).NumViewports = '\x01';
  (pGVar1->Desc).NumRenderTargets = '\0';
  (pGVar1->Desc).SubpassIndex = '\0';
  (pGVar1->Desc).ShadingRateFlags = PIPELINE_SHADING_RATE_FLAG_NONE;
  (pGVar1->Desc).RTVFormats[0] = TEX_FORMAT_UNKNOWN;
  (pGVar1->Desc).RTVFormats[1] = TEX_FORMAT_UNKNOWN;
  (pGVar1->Desc).RTVFormats[2] = TEX_FORMAT_UNKNOWN;
  (pGVar1->Desc).RTVFormats[3] = TEX_FORMAT_UNKNOWN;
  (pGVar1->Desc).RTVFormats[4] = TEX_FORMAT_UNKNOWN;
  (pGVar1->Desc).RTVFormats[5] = TEX_FORMAT_UNKNOWN;
  (pGVar1->Desc).RTVFormats[6] = TEX_FORMAT_UNKNOWN;
  (pGVar1->Desc).RTVFormats[7] = TEX_FORMAT_UNKNOWN;
  *(undefined4 *)((long)(pGVar1->Desc).RTVFormats + 0xf) = 0;
  (pGVar1->Desc).SmplDesc.Count = '\x01';
  (pGVar1->Desc).SmplDesc.Quality = '\0';
  (pGVar1->Desc).pRenderPass = (IRenderPass *)0x0;
  (pGVar1->Desc).NodeMask = 0;
  pGVar1->dvpRenderTargetFormatsHash = 0;
  (pGVar1->pRenderPass).m_pObject = (IRenderPass *)0x0;
  pGVar1->pStrides = (Uint32 *)0x0;
  pGVar1->BufferSlotsUsed = '\0';
  return pGVar1;
}

Assistant:

NODISCARD T* Construct(Args&&... args)
    {
        T* Ptr = Allocate<T>();
        new (Ptr) T{std::forward<Args>(args)...};
        return Ptr;
    }